

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  SrcList *pSVar1;
  Bitmask BVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  long lVar7;
  Expr **ppEVar8;
  Bitmask BVar9;
  
  BVar9 = 0;
  for (; pS != (Select *)0x0; pS = pS->pPrior) {
    pSVar1 = pS->pSrc;
    BVar2 = sqlite3WhereExprListUsage(pMaskSet,pS->pEList);
    BVar3 = sqlite3WhereExprListUsage(pMaskSet,pS->pGroupBy);
    BVar4 = sqlite3WhereExprListUsage(pMaskSet,pS->pOrderBy);
    BVar5 = sqlite3WhereExprUsage(pMaskSet,pS->pWhere);
    BVar6 = sqlite3WhereExprUsage(pMaskSet,pS->pHaving);
    BVar9 = BVar6 | BVar9 | BVar5 | BVar4 | BVar3 | BVar2;
    if (pSVar1 != (SrcList *)0x0) {
      ppEVar8 = &pSVar1->a[0].pOn;
      for (lVar7 = 0; lVar7 < pSVar1->nSrc; lVar7 = lVar7 + 1) {
        BVar2 = exprSelectUsage(pMaskSet,(Select *)ppEVar8[-4]);
        BVar3 = sqlite3WhereExprUsage(pMaskSet,*ppEVar8);
        BVar9 = BVar9 | BVar3 | BVar2;
        ppEVar8 = ppEVar8 + 0xe;
      }
    }
  }
  return BVar9;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectUsage(pMaskSet, pSrc->a[i].pSelect);
        mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].pOn);
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}